

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_cipher_finish(psa_cipher_operation_t *operation,uint8_t *output,size_t output_size,
                 size_t *output_length)

{
  ulong __n;
  int ret;
  psa_status_t pVar1;
  uint8_t temp_output_buffer [16];
  
  if ((operation->field_0x4 & 6) == 2 || (operation->field_0x4 & 1) == 0) {
    return -0x89;
  }
  if ((((operation->ctx).cipher.operation != MBEDTLS_ENCRYPT) || (operation->alg != 0x4600100)) ||
     (pVar1 = -0x87, (operation->ctx).cipher.unprocessed_len == 0)) {
    ret = mbedtls_cipher_finish(&(operation->ctx).cipher,temp_output_buffer,output_length);
    if (ret == 0) {
      __n = *output_length;
      if (__n != 0) {
        pVar1 = -0x8a;
        if (output_size < __n) goto LAB_00112794;
        memcpy(output,temp_output_buffer,__n);
      }
      mbedtls_platform_zeroize(temp_output_buffer,0x10);
      pVar1 = psa_cipher_abort(operation);
      return pVar1;
    }
    pVar1 = mbedtls_to_psa_error(ret);
  }
LAB_00112794:
  *output_length = 0;
  mbedtls_platform_zeroize(temp_output_buffer,0x10);
  psa_cipher_abort(operation);
  return pVar1;
}

Assistant:

psa_status_t psa_cipher_finish( psa_cipher_operation_t *operation,
                                uint8_t *output,
                                size_t output_size,
                                size_t *output_length )
{
    psa_status_t status = PSA_ERROR_GENERIC_ERROR;
    int cipher_ret = MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
    uint8_t temp_output_buffer[MBEDTLS_MAX_BLOCK_LENGTH];

    if( ! operation->key_set )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( operation->iv_required && ! operation->iv_set )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    if( operation->ctx.cipher.operation == MBEDTLS_ENCRYPT &&
        operation->alg == PSA_ALG_CBC_NO_PADDING &&
        operation->ctx.cipher.unprocessed_len != 0 )
    {
            status = PSA_ERROR_INVALID_ARGUMENT;
            goto error;
    }

    cipher_ret = mbedtls_cipher_finish( &operation->ctx.cipher,
                                        temp_output_buffer,
                                        output_length );
    if( cipher_ret != 0 )
    {
        status = mbedtls_to_psa_error( cipher_ret );
        goto error;
    }

    if( *output_length == 0 )
        ; /* Nothing to copy. Note that output may be NULL in this case. */
    else if( output_size >= *output_length )
        memcpy( output, temp_output_buffer, *output_length );
    else
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto error;
    }

    mbedtls_platform_zeroize( temp_output_buffer, sizeof( temp_output_buffer ) );
    status = psa_cipher_abort( operation );

    return( status );

error:

    *output_length = 0;

    mbedtls_platform_zeroize( temp_output_buffer, sizeof( temp_output_buffer ) );
    (void) psa_cipher_abort( operation );

    return( status );
}